

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_bit.c
# Opt level: O0

int bit_result64(lua_State *L,CTypeID id,uint64_t x)

{
  void *pvVar1;
  GCcdata *cd;
  uint64_t x_local;
  CTypeID id_local;
  lua_State *L_local;
  GCcdata *cd_1;
  
  pvVar1 = lj_mem_newgco(L,0x18);
  *(undefined1 *)((long)pvVar1 + 9) = 10;
  *(short *)((long)pvVar1 + 10) = (short)id;
  *(uint64_t *)((long)pvVar1 + 0x10) = x;
  L->base[-2].u64 = (ulong)pvVar1 | 0xfffa800000000000;
  return 2;
}

Assistant:

static int bit_result64(lua_State *L, CTypeID id, uint64_t x)
{
  GCcdata *cd = lj_cdata_new_(L, id, 8);
  *(uint64_t *)cdataptr(cd) = x;
  setcdataV(L, L->base-1-LJ_FR2, cd);
  return FFH_RES(1);
}